

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall
QWidgetPrivate::setGeometry_sys(QWidgetPrivate *this,int x,int y,int w,int h,bool isMove)

{
  QWidgetData *pQVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  QWidget *this_00;
  pointer pQVar6;
  int *piVar7;
  QTLWExtra *pQVar8;
  QWindow *pQVar9;
  QWidgetPrivate *atopLeft;
  QRect *pQVar10;
  ulong uVar11;
  int in_ECX;
  int in_EDX;
  WidgetAttribute in_ESI;
  QWidgetPrivate *in_RDI;
  int in_R8D;
  byte in_R9B;
  long in_FS_OFFSET;
  QWindow *win;
  bool needsShow;
  bool isResize;
  QPlatformIntegration *integration;
  QWidget *q;
  QResizeEvent e_1;
  QMoveEvent e;
  QRegion updateRegion;
  QPoint posInNativeParent;
  QPoint oldPos;
  QRect r;
  QSize olds;
  QPoint oldp;
  QAccessibleEvent event;
  uint in_stack_fffffffffffffe48;
  WidgetAttribute in_stack_fffffffffffffe4c;
  int in_stack_fffffffffffffe50;
  WidgetAttribute in_stack_fffffffffffffe54;
  QWidget *in_stack_fffffffffffffe58;
  QWidget *in_stack_fffffffffffffe60;
  QWidgetPrivate *in_stack_fffffffffffffe68;
  QWidgetPrivate *in_stack_fffffffffffffe70;
  bool local_181;
  bool local_16a;
  QWidgetPrivate *in_stack_fffffffffffffe98;
  QWidget *pQVar12;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 on;
  WidgetAttribute WVar13;
  QWidgetPrivate *this_01;
  QSize local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  QPoint local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  undefined1 local_d8 [16];
  QRegion local_c8;
  QSize local_c0;
  QPoint local_a0;
  undefined8 local_98;
  undefined8 local_90;
  QPoint local_88;
  undefined8 local_80;
  undefined8 local_78;
  QPoint local_70;
  QSize local_68;
  QPoint local_60;
  QSize local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  QSize local_40;
  QPoint local_38;
  int local_30;
  int local_2c;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_R9B & 1;
  this_01 = in_RDI;
  local_30 = in_R8D;
  local_2c = in_ECX;
  this_00 = q_func(in_RDI);
  bVar3 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x375283);
  if (bVar3) {
    pQVar6 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x37529a);
    piVar7 = qMin<int>(&local_2c,&pQVar6->maxw);
    local_2c = *piVar7;
    pQVar6 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3752c5);
    piVar7 = qMin<int>(&local_30,&pQVar6->maxh);
    local_30 = *piVar7;
    pQVar6 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3752f0);
    piVar7 = qMax<int>(&local_2c,&pQVar6->minw);
    local_2c = *piVar7;
    pQVar6 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x37531b);
    piVar7 = qMax<int>(&local_30,&pQVar6->minh);
    local_30 = *piVar7;
  }
  bVar3 = QWidget::isWindow((QWidget *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                           );
  if ((bVar3) &&
     (pQVar9 = QWidget::windowHandle
                         ((QWidget *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)),
     pQVar9 != (QWindow *)0x0)) {
    in_stack_fffffffffffffe98 = (QWidgetPrivate *)QGuiApplicationPrivate::platformIntegration();
    uVar11 = (**(code **)(*(long *)in_stack_fffffffffffffe98 + 0x10))(in_stack_fffffffffffffe98,10);
    if ((uVar11 & 1) == 0) {
      in_ESI = WA_Disabled;
      in_EDX = 0;
      QWidget::windowHandle
                ((QWidget *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      local_2c = QWindow::width((QWindow *)
                                CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      QWidget::windowHandle
                ((QWidget *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      local_30 = QWindow::height((QWindow *)
                                 CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    }
  }
  local_38 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  QWidget::geometry(this_00);
  local_38 = QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  local_40 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = QWidget::size((QWidget *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))
  ;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  QRect::QRect((QRect *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
               in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
  local_58 = QRect::size((QRect *)in_stack_fffffffffffffe60);
  bVar3 = ::operator!=((QSize *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       (QSize *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  if ((bVar2 & 1) == 0) {
    local_60 = QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)
                             );
    bVar2 = ::operator!=((QPoint *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                         (QPoint *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  }
  local_68 = QRect::size((QRect *)in_stack_fffffffffffffe60);
  bVar4 = ::operator==((QSize *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       (QSize *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  local_181 = false;
  if (bVar4) {
    local_70 = QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)
                             );
    local_181 = ::operator==((QPoint *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                             ,(QPoint *)
                              CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  }
  if (local_181 == false) {
    if ((*(uint *)&(in_RDI->data).field_0x10 >> 0xb & 1) == 0) {
      pQVar1 = this_00->data;
      *(uint *)&pQVar1->field_0x10 =
           *(uint *)&pQVar1->field_0x10 & 0xfffffff0 | *(uint *)&pQVar1->field_0x10 & 0xd;
      pQVar1 = this_00->data;
      *(uint *)&pQVar1->field_0x10 =
           *(uint *)&pQVar1->field_0x10 & 0xfffffff0 | *(uint *)&pQVar1->field_0x10 & 0xb;
      bVar4 = QWidget::isWindow((QWidget *)
                                CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      if (bVar4) {
        QRect::QRect((QRect *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                     in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
        pQVar8 = topData((QWidgetPrivate *)
                         CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
        (pQVar8->normalGeometry).x1 = (Representation)(undefined4)local_80;
        (pQVar8->normalGeometry).y1 = (Representation)local_80._4_4_;
        (pQVar8->normalGeometry).x2 = (Representation)(undefined4)local_78;
        (pQVar8->normalGeometry).y2 = (Representation)local_78._4_4_;
      }
    }
    local_88 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = QWidget::pos(in_stack_fffffffffffffe58);
    *(undefined1 **)&(in_RDI->data).crect = local_50;
    *(undefined1 **)&(in_RDI->data).crect.x2 = local_48;
    local_16a = false;
    bVar4 = QWidget::isWindow((QWidget *)
                              CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    if ((bVar4) ||
       (pQVar9 = QWidget::windowHandle
                           ((QWidget *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                           ), pQVar9 != (QWindow *)0x0)) {
      if (((*(uint *)&(in_RDI->data).field_0x10 & 4) == 0) && ((local_2c == 0 || (local_30 == 0))))
      {
        QWidget::setAttribute((QWidget *)this_01,in_ESI,SUB41((uint)in_EDX >> 0x18,0));
        bVar4 = QWidget::isVisible((QWidget *)0x37568b);
        if (bVar4) {
          hide_sys(in_stack_fffffffffffffe68);
        }
        QRect::QRect((QRect *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                     in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
        (in_RDI->data).crect.x1 = (Representation)(undefined4)local_98;
        (in_RDI->data).crect.y1 = (Representation)local_98._4_4_;
        (in_RDI->data).crect.x2 = (Representation)(undefined4)local_90;
        (in_RDI->data).crect.y2 = (Representation)local_90._4_4_;
      }
      else {
        local_16a = QWidget::testAttribute(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54);
        if (local_16a) {
          QWidget::setAttribute((QWidget *)this_01,in_ESI,SUB41((uint)in_EDX >> 0x18,0));
        }
      }
    }
    bVar4 = QWidget::isVisible((QWidget *)0x37571d);
    if (bVar4) {
      bVar4 = QWidget::testAttribute(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54);
      if ((!bVar4) &&
         (bVar4 = QWidget::testAttribute(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54),
         !bVar4)) {
        atopLeft = (QWidgetPrivate *)
                   QWidget::windowHandle
                             ((QWidget *)
                              CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
        if (atopLeft != (QWidgetPrivate *)0x0) {
          bVar4 = QWidget::isWindow((QWidget *)
                                    CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
          if (bVar4) {
            if ((bVar3) && ((bVar2 & 1) == 0)) {
              QWindow::resize((int)atopLeft,local_2c);
              atopLeft = in_stack_fffffffffffffe70;
            }
            else if (((bVar2 & 1) == 0) || (bVar3)) {
              QWidget::geometry(this_00);
              QWindow::setGeometry((QRect *)atopLeft);
            }
            else {
              QWindow::setPosition((int)atopLeft,in_ESI);
              atopLeft = in_stack_fffffffffffffe70;
            }
          }
          else {
            local_a0 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
            pQVar12 = this_00;
            in_stack_fffffffffffffe60 =
                 QWidget::nativeParentWidget
                           ((QWidget *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                           );
            QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
            local_a0 = QWidget::mapTo((QWidget *)in_stack_fffffffffffffe70,
                                      (QWidget *)in_stack_fffffffffffffe68,
                                      (QPoint *)in_stack_fffffffffffffe60);
            local_c0 = QRect::size((QRect *)in_stack_fffffffffffffe60);
            QRect::QRect((QRect *)in_stack_fffffffffffffe70,(QPoint *)atopLeft,
                         (QSize *)in_stack_fffffffffffffe60);
            QWindow::setGeometry((QRect *)atopLeft);
            in_stack_fffffffffffffe58 = this_00;
            in_stack_fffffffffffffe68 = atopLeft;
            atopLeft = in_stack_fffffffffffffe70;
            this_00 = pQVar12;
          }
          in_stack_fffffffffffffe70 = atopLeft;
          if (local_16a != false) {
            show_sys(in_stack_fffffffffffffe98);
            in_stack_fffffffffffffe70 = atopLeft;
          }
        }
        bVar4 = QWidget::isWindow((QWidget *)
                                  CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
        if (!bVar4) {
          if ((*(uint *)&in_RDI->field_0x250 >> 0x18 & 1) == 0) {
            if (((bVar2 & 1) == 0) || (bVar3)) {
              invalidateBackingStore_resizeHelper
                        (this_01,(QPoint *)CONCAT44(in_ESI,in_EDX),
                         (QSize *)CONCAT17(bVar2,in_stack_fffffffffffffea8));
            }
            else {
              in_stack_fffffffffffffe4c = in_ESI;
              QRect::QRect((QRect *)in_stack_fffffffffffffe70,(QPoint *)in_stack_fffffffffffffe68,
                           (QSize *)in_stack_fffffffffffffe60);
              in_stack_fffffffffffffe50 = in_EDX;
              WVar13 = in_stack_fffffffffffffe4c;
              iVar5 = QPoint::x((QPoint *)0x3759a3);
              in_stack_fffffffffffffe54 = in_stack_fffffffffffffe4c - iVar5;
              iVar5 = in_stack_fffffffffffffe50;
              QPoint::y((QPoint *)0x3759c4);
              moveRect((QWidgetPrivate *)CONCAT44(WVar13,iVar5),
                       (QRect *)CONCAT17(bVar2,in_stack_fffffffffffffea8),
                       (int)((ulong)this_00 >> 0x20),(int)this_00);
            }
          }
          else {
            local_c8.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
            pQVar10 = QWidget::geometry(this_00);
            QRegion::QRegion(&local_c8,(QRect *)pQVar10,Rectangle);
            QRect::QRect((QRect *)in_stack_fffffffffffffe70,(QPoint *)in_stack_fffffffffffffe68,
                         (QSize *)in_stack_fffffffffffffe60);
            QRegion::operator+=(&local_c8,(QRect *)local_d8);
            QWidget::parentWidget((QWidget *)0x375939);
            QWidget::d_func((QWidget *)0x375941);
            invalidateBackingStore<QRegion>
                      (in_stack_fffffffffffffe68,(QRegion *)in_stack_fffffffffffffe60);
            QRegion::~QRegion(&local_c8);
          }
        }
      }
      if ((bVar2 & 1) != 0) {
        local_108 = &DAT_aaaaaaaaaaaaaaaa;
        local_100 = &DAT_aaaaaaaaaaaaaaaa;
        local_f8 = &DAT_aaaaaaaaaaaaaaaa;
        local_f0 = &DAT_aaaaaaaaaaaaaaaa;
        local_110 = QWidget::pos(in_stack_fffffffffffffe58);
        QMoveEvent::QMoveEvent((QMoveEvent *)&local_108,(QPoint *)&local_110,(QPoint *)&local_88);
        QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)&local_108);
        QMoveEvent::~QMoveEvent((QMoveEvent *)&local_108);
      }
      if (bVar3) {
        local_130 = &DAT_aaaaaaaaaaaaaaaa;
        local_128 = &DAT_aaaaaaaaaaaaaaaa;
        local_120 = &DAT_aaaaaaaaaaaaaaaa;
        local_118 = &DAT_aaaaaaaaaaaaaaaa;
        local_138 = QRect::size((QRect *)in_stack_fffffffffffffe60);
        QResizeEvent::QResizeEvent
                  ((QResizeEvent *)&local_130,(QSize *)&local_138,(QSize *)&local_40);
        QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)&local_130);
        pQVar9 = QWidget::windowHandle
                           ((QWidget *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                           );
        if (pQVar9 != (QWindow *)0x0) {
          QWidget::update((QWidget *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        }
        QResizeEvent::~QResizeEvent((QResizeEvent *)&local_130);
      }
    }
    else {
      in_stack_fffffffffffffe48 = in_stack_fffffffffffffe48 & 0xffffff;
      if ((bVar2 & 1) != 0) {
        QWidget::pos(in_stack_fffffffffffffe58);
        bVar4 = ::operator!=((QPoint *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                             ,(QPoint *)
                              CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        in_stack_fffffffffffffe48 = (uint)bVar4 << 0x18;
      }
      on = (undefined1)((uint)in_EDX >> 0x18);
      if ((char)(in_stack_fffffffffffffe48 >> 0x18) != '\0') {
        QWidget::setAttribute((QWidget *)this_01,in_ESI,(bool)on);
      }
      if (bVar3) {
        QWidget::setAttribute((QWidget *)this_01,in_ESI,(bool)on);
      }
    }
    uVar11 = QAccessible::isActive();
    if (((uVar11 & 1) != 0) && (bVar3 = QWidget::isVisible((QWidget *)0x375bcd), bVar3)) {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QAccessibleEvent::QAccessibleEvent
                ((QAccessibleEvent *)&local_28,&this_00->super_QObject,LocationChanged);
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_28);
      QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::setGeometry_sys(int x, int y, int w, int h, bool isMove)
{
    Q_Q(QWidget);
    if (extra) {                                // any size restrictions?
        w = qMin(w,extra->maxw);
        h = qMin(h,extra->maxh);
        w = qMax(w,extra->minw);
        h = qMax(h,extra->minh);
    }

    if (q->isWindow() && q->windowHandle()) {
        QPlatformIntegration *integration = QGuiApplicationPrivate::platformIntegration();
        if (!integration->hasCapability(QPlatformIntegration::NonFullScreenWindows)) {
            x = 0;
            y = 0;
            w = q->windowHandle()->width();
            h = q->windowHandle()->height();
        }
    }

    QPoint oldp = q->geometry().topLeft();
    QSize olds = q->size();
    QRect r(x, y, w, h);

    bool isResize = olds != r.size();
    if (!isMove)
        isMove = oldp != r.topLeft();


    // We only care about stuff that changes the geometry, or may
    // cause the window manager to change its state
    if (r.size() == olds && oldp == r.topLeft())
        return;

    if (!data.in_set_window_state) {
        q->data->window_state &= ~Qt::WindowMaximized;
        q->data->window_state &= ~Qt::WindowFullScreen;
        if (q->isWindow())
            topData()->normalGeometry = QRect(0, 0, -1, -1);
    }

    QPoint oldPos = q->pos();
    data.crect = r;

    bool needsShow = false;

    if (q->isWindow() || q->windowHandle()) {
        if (!(data.window_state & Qt::WindowFullScreen) && (w == 0 || h == 0)) {
            q->setAttribute(Qt::WA_OutsideWSRange, true);
            if (q->isVisible())
                hide_sys();
            data.crect = QRect(x, y, w, h);
        } else if (q->testAttribute(Qt::WA_OutsideWSRange)) {
            q->setAttribute(Qt::WA_OutsideWSRange, false);
            needsShow = true;
        }
    }

    if (q->isVisible()) {
        if (!q->testAttribute(Qt::WA_DontShowOnScreen) && !q->testAttribute(Qt::WA_OutsideWSRange)) {
            if (QWindow *win = q->windowHandle()) {
                if (q->isWindow()) {
                    if (isResize && !isMove)
                        win->resize(w, h);
                    else if (isMove && !isResize)
                        win->setPosition(x, y);
                    else
                        win->setGeometry(q->geometry());
                } else {
                    QPoint posInNativeParent =  q->mapTo(q->nativeParentWidget(),QPoint());
                    win->setGeometry(QRect(posInNativeParent,r.size()));
                }

                if (needsShow)
                    show_sys();
            }

            if (!q->isWindow()) {
                if (renderToTexture) {
                    QRegion updateRegion(q->geometry());
                    updateRegion += QRect(oldPos, olds);
                    q->parentWidget()->d_func()->invalidateBackingStore(updateRegion);
                } else if (isMove && !isResize) {
                    moveRect(QRect(oldPos, olds), x - oldPos.x(), y - oldPos.y());
                } else {
                    invalidateBackingStore_resizeHelper(oldPos, olds);
                }
            }
        }

        if (isMove) {
            QMoveEvent e(q->pos(), oldPos);
            QCoreApplication::sendEvent(q, &e);
        }
        if (isResize) {
            QResizeEvent e(r.size(), olds);
            QCoreApplication::sendEvent(q, &e);
            if (q->windowHandle())
                q->update();
        }
    } else { // not visible
        if (isMove && q->pos() != oldPos)
            q->setAttribute(Qt::WA_PendingMoveEvent, true);
        if (isResize)
            q->setAttribute(Qt::WA_PendingResizeEvent, true);
    }

#if QT_CONFIG(accessibility)
    if (QAccessible::isActive() && q->isVisible()) {
        QAccessibleEvent event(q, QAccessible::LocationChanged);
        QAccessible::updateAccessibility(&event);
    }
#endif
}